

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

void ContextBlockSplitterFinishBlock(ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint32_t uVar3;
  ulong uVar4;
  BlockSplit *pBVar5;
  uint32_t *puVar6;
  void *p;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  HistogramLiteral *pHVar13;
  void *pvVar14;
  double *pdVar15;
  uint *puVar16;
  uint *__dest;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double diff [2];
  double entropy [13];
  double combined_entropy [26];
  HistogramLiteral *local_228;
  double local_1d8 [4];
  MemoryManager *local_1b8;
  void *local_1b0;
  double *local_1a8;
  HistogramLiteral *local_1a0;
  double local_198;
  double dStack_190;
  HistogramLiteral *local_188;
  HistogramLiteral *local_180;
  double adStack_178 [14];
  double adStack_108 [27];
  
  local_1b8 = m;
  uVar4 = self->min_block_size_;
  uVar11 = self->block_size_;
  if (self->block_size_ < uVar4) {
    self->block_size_ = uVar4;
    uVar11 = uVar4;
  }
  pBVar5 = self->split_;
  uVar4 = self->num_contexts_;
  pdVar15 = self->last_entropy_;
  local_228 = self->histograms_;
  if (self->num_blocks_ == 0) {
    *pBVar5->lengths = (uint32_t)uVar11;
    *pBVar5->types = '\0';
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      uVar10 = self->alphabet_size_;
      dVar26 = 0.0;
      uVar17 = 0;
      pHVar13 = local_228;
      if ((uVar10 & 1) != 0) goto LAB_00e26cab;
      while (pHVar13 < (HistogramLiteral *)(local_228->data_ + uVar10)) {
        uVar7 = (ulong)pHVar13->data_[0];
        pHVar13 = (HistogramLiteral *)(pHVar13->data_ + 1);
        uVar17 = uVar17 + uVar7;
        if (uVar7 < 0x100) {
          dVar20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar7 * 8);
        }
        else {
          dVar20 = log2((double)uVar7);
        }
        dVar26 = dVar26 - (double)uVar7 * dVar20;
LAB_00e26cab:
        uVar7 = (ulong)pHVar13->data_[0];
        pHVar13 = (HistogramLiteral *)(pHVar13->data_ + 1);
        uVar17 = uVar17 + uVar7;
        if (uVar7 < 0x100) {
          dVar20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar7 * 8);
        }
        else {
          dVar20 = log2((double)uVar7);
        }
        dVar26 = dVar26 - (double)uVar7 * dVar20;
      }
      auVar22._8_4_ = (int)(uVar17 >> 0x20);
      auVar22._0_8_ = uVar17;
      auVar22._12_4_ = 0x45300000;
      dVar20 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
      if (uVar17 != 0) {
        if (uVar17 < 0x100) {
          dVar21 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar17 * 8);
        }
        else {
          dVar21 = log2(dVar20);
        }
        dVar26 = dVar26 + dVar21 * dVar20;
      }
      if (dVar20 <= dVar26) {
        dVar20 = dVar26;
      }
      self->last_entropy_[uVar11] = dVar20;
      pdVar15[uVar4 + uVar11] = dVar20;
      local_228 = local_228 + 1;
    }
    self->num_blocks_ = self->num_blocks_ + 1;
    pBVar5->num_types = pBVar5->num_types + 1;
    uVar11 = self->curr_histogram_ix_ + uVar4;
    self->curr_histogram_ix_ = uVar11;
    if (uVar11 < *self->histograms_size_) {
      pHVar13 = self->histograms_ + uVar11;
      sVar12 = self->num_contexts_;
      while (bVar19 = sVar12 != 0, sVar12 = sVar12 - 1, bVar19) {
        switchD_004a0b15::default(pHVar13,0,0x408);
        pHVar13->bit_cost_ = INFINITY;
        pHVar13 = pHVar13 + 1;
      }
    }
    self->block_size_ = 0;
  }
  else if (uVar11 != 0) {
    if ((uVar4 & 0x7fffffffffffffff) == 0) {
      p = (void *)0x0;
    }
    else {
      p = duckdb_brotli::BrotliAllocate(m,uVar4 * 0x820);
    }
    local_1d8[0] = 0.0;
    local_1d8[1] = 0.0;
    local_1a0 = local_228;
    local_1b0 = p;
    local_1a8 = pdVar15;
    for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
      local_188 = local_228 + uVar11;
      pHVar13 = local_228 + uVar11 + self->curr_histogram_ix_;
      uVar10 = self->alphabet_size_;
      puVar6 = pHVar13->data_;
      dVar26 = 0.0;
      uVar17 = 0;
      local_180 = pHVar13;
      if ((uVar10 & 1) != 0) goto LAB_00e26ee8;
      while (pHVar13 < (HistogramLiteral *)(puVar6 + uVar10)) {
        uVar7 = (ulong)pHVar13->data_[0];
        pHVar13 = (HistogramLiteral *)(pHVar13->data_ + 1);
        uVar17 = uVar17 + uVar7;
        if (uVar7 < 0x100) {
          dVar20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar7 * 8);
        }
        else {
          dVar20 = log2((double)uVar7);
        }
        dVar26 = dVar26 - (double)uVar7 * dVar20;
LAB_00e26ee8:
        uVar7 = (ulong)pHVar13->data_[0];
        pHVar13 = (HistogramLiteral *)(pHVar13->data_ + 1);
        uVar17 = uVar17 + uVar7;
        if (uVar7 < 0x100) {
          dVar20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar7 * 8);
        }
        else {
          dVar20 = log2((double)uVar7);
        }
        dVar26 = dVar26 - (double)uVar7 * dVar20;
      }
      auVar23._8_4_ = (int)(uVar17 >> 0x20);
      auVar23._0_8_ = uVar17;
      auVar23._12_4_ = 0x45300000;
      dStack_190 = auVar23._8_8_ - 1.9342813113834067e+25;
      local_198 = dStack_190 + ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
      if (uVar17 != 0) {
        if (uVar17 < 0x100) {
          dVar20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar17 * 8);
        }
        else {
          dVar20 = log2(local_198);
        }
        dVar26 = dVar26 + dVar20 * local_198;
      }
      if (local_198 <= dVar26) {
        local_198 = dVar26;
      }
      adStack_178[uVar11] = local_198;
      pvVar14 = local_1b0;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        lVar18 = lVar9 * uVar4 + uVar11;
        __dest = (uint *)((long)p + lVar18 * 0x410);
        sVar12 = self->last_histogram_ix_[lVar9];
        switchD_00917c1c::default(__dest,local_180,0x410);
        plVar2 = (long *)((long)p + lVar18 * 0x410 + 0x400);
        *plVar2 = *plVar2 + local_188[sVar12].total_count_;
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          piVar1 = (int *)((long)pvVar14 + lVar8 * 4);
          *piVar1 = *piVar1 + local_1a0[sVar12].data_[lVar8];
        }
        puVar16 = __dest + self->alphabet_size_;
        dVar26 = 0.0;
        uVar10 = 0;
        if ((self->alphabet_size_ & 1) != 0) goto LAB_00e270e0;
        while (pdVar15 = local_1a8, __dest < puVar16) {
          uVar17 = (ulong)*__dest;
          __dest = __dest + 1;
          uVar10 = uVar10 + uVar17;
          dVar20 = (double)uVar17;
          if (uVar17 < 0x100) {
            dVar21 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar17 * 8);
          }
          else {
            local_1d8[2] = dVar20;
            dVar21 = log2(dVar20);
            dVar20 = local_1d8[2];
          }
          dVar26 = dVar26 - dVar20 * dVar21;
LAB_00e270e0:
          uVar17 = (ulong)*__dest;
          __dest = __dest + 1;
          uVar10 = uVar10 + uVar17;
          dVar20 = (double)uVar17;
          if (uVar17 < 0x100) {
            dVar21 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar17 * 8);
          }
          else {
            local_1d8[2] = dVar20;
            dVar21 = log2(dVar20);
            dVar20 = local_1d8[2];
          }
          dVar26 = dVar26 - dVar20 * dVar21;
        }
        auVar24._8_4_ = (int)(uVar10 >> 0x20);
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = 0x45300000;
        dVar21 = auVar24._8_8_ - 1.9342813113834067e+25;
        dVar20 = dVar21 + ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
        if (uVar10 != 0) {
          if (uVar10 < 0x100) {
            dVar21 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar10 * 8);
          }
          else {
            local_1d8[2] = dVar20;
            local_1d8[3] = dVar21;
            dVar21 = log2(dVar20);
            dVar20 = local_1d8[2];
          }
          dVar26 = dVar26 + dVar21 * dVar20;
        }
        if (dVar20 <= dVar26) {
          dVar20 = dVar26;
        }
        adStack_108[lVar18] = dVar20;
        local_1d8[lVar9] = ((dVar20 - local_198) - pdVar15[lVar18]) + local_1d8[lVar9];
        pvVar14 = (void *)((long)pvVar14 + uVar4 * 0x410);
      }
      local_1b0 = (void *)((long)local_1b0 + 0x410);
      local_1a0 = local_1a0 + 1;
    }
    uVar11 = pBVar5->num_types;
    if (((self->max_block_types_ <= uVar11) || (local_1d8[0] <= self->split_threshold_)) ||
       (local_1d8[1] <= self->split_threshold_)) {
      uVar3 = (uint32_t)self->block_size_;
      sVar12 = self->num_blocks_;
      if (local_1d8[0] + -20.0 <= local_1d8[1]) {
        puVar6 = pBVar5->lengths + (sVar12 - 1);
        *puVar6 = *puVar6 + uVar3;
        lVar9 = 0;
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          switchD_00917c1c::default
                    ((void *)((long)local_228[self->last_histogram_ix_[0]].data_ + lVar9),
                     (void *)((long)p + lVar9),0x410);
          dVar26 = adStack_108[uVar11];
          self->last_entropy_[uVar11] = dVar26;
          if (pBVar5->num_types == 1) {
            pdVar15[uVar4 + uVar11] = dVar26;
          }
          sVar12 = self->curr_histogram_ix_;
          switchD_004a0b15::default((void *)((long)local_228[sVar12].data_ + lVar9),0,0x408);
          *(undefined8 *)((long)&local_228[sVar12].bit_cost_ + lVar9) = 0x7ff0000000000000;
          lVar9 = lVar9 + 0x410;
        }
        self->block_size_ = 0;
        uVar11 = self->merge_last_count_ + 1;
        self->merge_last_count_ = uVar11;
        if (1 < uVar11) {
          self->target_block_size_ = self->target_block_size_ + self->min_block_size_;
        }
      }
      else {
        pBVar5->lengths[sVar12] = uVar3;
        pBVar5->types[sVar12] = pBVar5->types[sVar12 - 2];
        auVar22 = *(undefined1 (*) [16])self->last_histogram_ix_;
        auVar25._0_8_ = auVar22._8_8_;
        auVar25._8_4_ = auVar22._0_4_;
        auVar25._12_4_ = auVar22._4_4_;
        *(undefined1 (*) [16])self->last_histogram_ix_ = auVar25;
        lVar9 = 0;
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          switchD_00917c1c::default
                    ((void *)((long)local_228[self->last_histogram_ix_[0]].data_ + lVar9),
                     (void *)((long)p + lVar9 + uVar4 * 0x410),0x410);
          self->last_entropy_[uVar4 + uVar11] = self->last_entropy_[uVar11];
          self->last_entropy_[uVar11] = adStack_108[uVar4 + uVar11];
          sVar12 = self->curr_histogram_ix_;
          switchD_004a0b15::default((void *)((long)local_228[sVar12].data_ + lVar9),0,0x408);
          *(undefined8 *)((long)&local_228[sVar12].bit_cost_ + lVar9) = 0x7ff0000000000000;
          lVar9 = lVar9 + 0x410;
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        self->target_block_size_ = self->min_block_size_;
      }
    }
    else {
      sVar12 = self->num_blocks_;
      pBVar5->lengths[sVar12] = (uint32_t)self->block_size_;
      pBVar5->types[sVar12] = (uint8_t)uVar11;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = pBVar5->num_types * uVar4;
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        pdVar15[uVar4 + uVar11] = pdVar15[uVar11];
        pdVar15[uVar11] = adStack_178[uVar11];
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      pBVar5->num_types = pBVar5->num_types + 1;
      uVar11 = self->curr_histogram_ix_ + uVar4;
      self->curr_histogram_ix_ = uVar11;
      if (uVar11 < *self->histograms_size_) {
        pHVar13 = self->histograms_ + uVar11;
        sVar12 = self->num_contexts_;
        while (bVar19 = sVar12 != 0, sVar12 = sVar12 - 1, bVar19) {
          switchD_004a0b15::default(pHVar13,0,0x408);
          pHVar13->bit_cost_ = INFINITY;
          pHVar13 = pHVar13 + 1;
        }
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    }
    duckdb_brotli::BrotliFree(local_1b8,p);
  }
  if (is_final != 0) {
    *self->histograms_size_ = uVar4 * pBVar5->num_types;
    pBVar5->num_blocks = self->num_blocks_;
  }
  return;
}

Assistant:

static void ContextBlockSplitterFinishBlock(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  double* last_entropy = self->last_entropy_;
  HistogramLiteral* histograms = self->histograms_;

  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    size_t i;
    /* Create first block. */
    split->lengths[0] = (uint32_t)self->block_size_;
    split->types[0] = 0;

    for (i = 0; i < num_contexts; ++i) {
      last_entropy[i] =
          BitsEntropy(histograms[i].data_, self->alphabet_size_);
      last_entropy[num_contexts + i] = last_entropy[i];
    }
    ++self->num_blocks_;
    ++split->num_types;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    /* Try merging the set of histograms for the current block type with the
       respective set of histograms for the last and second last block types.
       Decide over the split based on the total reduction of entropy across
       all contexts. */
    double entropy[BROTLI_MAX_STATIC_CONTEXTS];
    HistogramLiteral* combined_histo =
        BROTLI_ALLOC(m, HistogramLiteral, 2 * num_contexts);
    double combined_entropy[2 * BROTLI_MAX_STATIC_CONTEXTS];
    double diff[2] = { 0.0 };
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;
    for (i = 0; i < num_contexts; ++i) {
      size_t curr_histo_ix = self->curr_histogram_ix_ + i;
      size_t j;
      entropy[i] = BitsEntropy(histograms[curr_histo_ix].data_,
                               self->alphabet_size_);
      for (j = 0; j < 2; ++j) {
        size_t jx = j * num_contexts + i;
        size_t last_histogram_ix = self->last_histogram_ix_[j] + i;
        combined_histo[jx] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[jx],
            &histograms[last_histogram_ix]);
        combined_entropy[jx] = BitsEntropy(
            &combined_histo[jx].data_[0], self->alphabet_size_);
        diff[j] += combined_entropy[jx] - entropy[i] - last_entropy[jx];
      }
    }

    if (split->num_types < self->max_block_types_ &&
        diff[0] > self->split_threshold_ &&
        diff[1] > self->split_threshold_) {
      /* Create new block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = (uint8_t)split->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = split->num_types * num_contexts;
      for (i = 0; i < num_contexts; ++i) {
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = entropy[i];
      }
      ++self->num_blocks_;
      ++split->num_types;
      self->curr_histogram_ix_ += num_contexts;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        ClearHistogramsLiteral(
            &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else if (diff[1] < diff[0] - 20.0) {
      /* Combine this block with second last block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = split->types[self->num_blocks_ - 2];
      BROTLI_SWAP(size_t, self->last_histogram_ix_, 0, 1);
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] =
            combined_histo[num_contexts + i];
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = combined_entropy[num_contexts + i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else {
      /* Combine this block with last block. */
      split->lengths[self->num_blocks_ - 1] += (uint32_t)self->block_size_;
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] = combined_histo[i];
        last_entropy[i] = combined_entropy[i];
        if (split->num_types == 1) {
          last_entropy[num_contexts + i] = last_entropy[i];
        }
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      self->block_size_ = 0;
      if (++self->merge_last_count_ > 1) {
        self->target_block_size_ += self->min_block_size_;
      }
    }
    BROTLI_FREE(m, combined_histo);
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
    split->num_blocks = self->num_blocks_;
  }
}